

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_ObjSuppSize_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int in_EDX;
  int Fill;
  int iVar6;
  long lVar7;
  
  pAVar2 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
  if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  iVar1 = pAVar3->nTravIds;
  iVar6 = 0;
  if ((pAVar2->vTravIds).pArray[iVar5] != iVar1) {
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
    if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar5] = iVar1;
    uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar4 == 2) {
      iVar6 = 1;
    }
    else {
      if ((uVar4 != 7) && (uVar4 != 10 && (*(uint *)&pObj->field_0x14 & 0xe) != 8)) {
        __assert_fail("Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x438,"int Abc_ObjSuppSize_rec(Abc_Obj_t *)");
      }
      iVar6 = 0;
      if (0 < (pObj->vFanins).nSize) {
        lVar7 = 0;
        iVar6 = 0;
        do {
          iVar5 = Abc_ObjSuppSize_rec((Abc_Obj_t *)
                                      pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]]);
          iVar6 = iVar6 + iVar5;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pObj->vFanins).nSize);
      }
    }
  }
  return iVar6;
}

Assistant:

int Abc_ObjSuppSize_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 0;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Abc_ObjIsPi(pObj) )
        return 1;
    assert( Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_ObjSuppSize_rec( pFanin );
    return Counter;
}